

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O1

void page_flush_tb_1(uc_struct_conflict15 *uc,int level,void **lp)

{
  long lVar1;
  void **extraout_RDX;
  undefined4 in_register_00000034;
  long lVar2;
  
  lVar1 = *(long *)CONCAT44(in_register_00000034,level);
  if (lVar1 != 0) {
    if ((int)uc == 0) {
      lVar2 = 0x10;
      do {
        *(undefined8 *)(lVar1 + -0x10 + lVar2) = 0;
        g_free(*(gpointer *)(lVar1 + -8 + lVar2));
        *(undefined8 *)(lVar1 + -8 + lVar2) = 0;
        *(undefined4 *)(lVar1 + lVar2) = 0;
        lVar2 = lVar2 + 0x18;
      } while (lVar2 != 0x6010);
    }
    else {
      lVar2 = 0;
      do {
        page_flush_tb_1((uc_struct_conflict15 *)(ulong)((int)uc - 1),(int)lVar1 + (int)lVar2,lp);
        lVar2 = lVar2 + 8;
        lp = extraout_RDX;
      } while (lVar2 != 0x2000);
    }
  }
  return;
}

Assistant:

static void page_flush_tb_1(struct uc_struct *uc, int level, void **lp)
{
    int i;

    if (*lp == NULL) {
        return;
    }
    if (level == 0) {
        PageDesc *pd = *lp;

        for (i = 0; i < V_L2_SIZE; ++i) {
            page_lock(&pd[i]);
            pd[i].first_tb = (uintptr_t)NULL;
            invalidate_page_bitmap(pd + i);
            page_unlock(&pd[i]);
        }
    } else {
        void **pp = *lp;

        for (i = 0; i < V_L2_SIZE; ++i) {
            page_flush_tb_1(uc, level - 1, pp + i);
        }
    }
}